

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O0

void fc_pkt_loss(fc_s *fc,uint32_t max_lost_sn,uint32_t n_loss,uint32_t n_timeout)

{
  int64_t iVar1;
  uint32_t n_timeout_local;
  uint32_t n_loss_local;
  uint32_t max_lost_sn_local;
  fc_s *fc_local;
  
  if ((fc->in_trouble == '\0') && ((uint)fc->TROUBLE_TOLERANCE <= n_loss + n_timeout)) {
    fc->in_trouble = '\x01';
    fc->max_lost_sn = max_lost_sn;
    iVar1 = MAX(2,(long)((float)fc->cwnd * fc->ssth_alpha));
    fc->ssthresh = (uint32_t)iVar1;
    fc->cwnd = fc->ssthresh;
    if (n_loss != 0) {
      fc->cwnd = (int)fc->DUP_ACK_LIM + fc->cwnd;
    }
    fc->incr = (float)(fc->cwnd * fc->MSS);
  }
  return;
}

Assistant:

void fc_pkt_loss(fc_s *fc, uint32_t max_lost_sn, uint32_t n_loss, uint32_t n_timeout) {
    if (!fc->in_trouble && (n_loss + n_timeout) >= fc->TROUBLE_TOLERANCE) {
        fc->in_trouble = 1;
        fc->max_lost_sn = max_lost_sn;
        fc->ssthresh = MAX(NMQ_SSTHRESH_MIN, fc->cwnd * fc->ssth_alpha);
        fc->cwnd = fc->ssthresh;  //todo: test the ratio. e.g. change to 0.5
        if (n_loss) {
            fc->cwnd += fc->DUP_ACK_LIM;
        }
        fc->incr = fc->cwnd * fc->MSS;
    }
}